

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.h
# Opt level: O0

Accessor * __thiscall
Assimp::ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
          (ColladaParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
          *pLibrary,string *pURL)

{
  bool bVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this_00;
  pointer ppVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1c8 [376];
  string local_50;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  string *pURL_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
  *pLibrary_local;
  ColladaParser *this_local;
  
  it._M_node = (_Base_ptr)pURL;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
       ::find(pLibrary,pURL);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
       ::end(pLibrary);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>
             ::operator->(&local_28);
    return &ppVar3->second;
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_1c8,(char (*) [38])"Unable to resolve library reference \"");
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             it._M_node);
  this_00 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (pbVar2,(char (*) [3])0xc6b23f);
  Formatter::basic_formatter::operator_cast_to_string(&local_50,this_00);
  ThrowException(this,&local_50);
}

Assistant:

const Type& ColladaParser::ResolveLibraryReference( const std::map<std::string, Type>& pLibrary, const std::string& pURL) const
    {
        typename std::map<std::string, Type>::const_iterator it = pLibrary.find( pURL);
        if( it == pLibrary.end())
            ThrowException( Formatter::format() << "Unable to resolve library reference \"" << pURL << "\"." );
        return it->second;
    }